

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O2

void __thiscall
booster::locale::impl_icu::icu_std_converter<char,_1>::uconv::uconv
          (uconv *this,string *charset,cpcvt_type cvt_type)

{
  UConverter *pUVar1;
  invalid_charset_error *this_00;
  code *pcVar2;
  UErrorCode err;
  string local_38;
  
  err = U_ZERO_ERROR;
  pUVar1 = (UConverter *)ucnv_open_70((charset->_M_dataplus)._M_p);
  this->cvt_ = pUVar1;
  if (pUVar1 != (UConverter *)0x0) {
    if (err < U_ILLEGAL_ARGUMENT_ERROR) {
      if (cvt_type == cvt_skip) {
        ucnv_setFromUCallBack_70(pUVar1,UCNV_FROM_U_CALLBACK_SKIP_70,0,0,0,&err);
        check_and_throw_icu_error(err);
        pcVar2 = UCNV_TO_U_CALLBACK_SKIP_70;
      }
      else {
        ucnv_setFromUCallBack_70(pUVar1,UCNV_FROM_U_CALLBACK_STOP_70,0,0,0,&err);
        check_and_throw_icu_error(err);
        pcVar2 = UCNV_TO_U_CALLBACK_STOP_70;
      }
      err = U_ZERO_ERROR;
      ucnv_setToUCallBack_70(this->cvt_,pcVar2,0,0,0);
      check_and_throw_icu_error(err);
      return;
    }
    ucnv_close_70(pUVar1);
  }
  this_00 = (invalid_charset_error *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,(string *)charset);
  conv::invalid_charset_error::invalid_charset_error(this_00,&local_38);
  __cxa_throw(this_00,&conv::invalid_charset_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

uconv(std::string const &charset,cpcvt_type cvt_type=cvt_skip) 
            {
                UErrorCode err=U_ZERO_ERROR;
                cvt_ = ucnv_open(charset.c_str(),&err);
                if(!cvt_ || U_FAILURE(err)) {
                    if(cvt_)
                        ucnv_close(cvt_);
                    throw conv::invalid_charset_error(charset);
                }
                
                try {
                    if(cvt_type==cvt_skip) {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_SKIP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                    else {
                        ucnv_setFromUCallBack(cvt_,UCNV_FROM_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                
                        err=U_ZERO_ERROR;
                        ucnv_setToUCallBack(cvt_,UCNV_TO_U_CALLBACK_STOP,0,0,0,&err);
                        check_and_throw_icu_error(err);
                    }
                }
                catch(...) { ucnv_close(cvt_) ; throw; }
            }